

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O1

void Abc_NtkLatchPipe(Abc_Ntk_t *pNtk,int nLatches)

{
  Abc_Obj_t *pNode;
  bool bVar1;
  uint nDigits;
  uint uVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t *pObj;
  char *pName;
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int Num;
  Abc_Obj_t *pFanin;
  int iVar9;
  int iVar10;
  
  if (nLatches < 1) {
    return;
  }
  nDigits = pNtk->vPis->nSize * nLatches;
  if (1 < nDigits) {
    uVar8 = 0;
    uVar2 = nDigits - 1;
    nDigits = uVar8;
    if (uVar2 != 0) {
      do {
        nDigits = uVar8 + 1;
        bVar1 = 9 < uVar2;
        uVar2 = uVar2 / 10;
        uVar8 = nDigits;
      } while (bVar1);
    }
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  pVVar4 = pNtk->vPis;
  if (0 < pVVar4->nSize) {
    iVar5 = 1;
    if (1 < nLatches) {
      iVar5 = nLatches;
    }
    iVar10 = 0;
    lVar6 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar4->pArray[lVar6];
      Abc_NodeCollectFanouts(pNode,vNodes);
      pFanin = pNode;
      iVar9 = iVar5;
      Num = iVar10;
      do {
        pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
        Abc_ObjAddFanin(pObj,pFanin);
        if ((*(uint *)&pObj->field_0x14 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                        ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
        }
        pObj->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
        pName = Abc_ObjNameDummy("LL",Num,nDigits);
        Abc_ObjAssignName(pObj,pName,(char *)0x0);
        Num = Num + 1;
        iVar9 = iVar9 + -1;
        pFanin = pObj;
      } while (iVar9 != 0);
      if (0 < vNodes->nSize) {
        lVar7 = 0;
        do {
          Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar7],pNode,pObj);
          lVar7 = lVar7 + 1;
        } while (lVar7 < vNodes->nSize);
      }
      lVar6 = lVar6 + 1;
      pVVar4 = pNtk->vPis;
      iVar10 = iVar10 + nLatches;
    } while (lVar6 < pVVar4->nSize);
  }
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  Abc_NtkLogicMakeSimpleCos(pNtk,0);
  return;
}

Assistant:

void Abc_NtkLatchPipe( Abc_Ntk_t * pNtk, int nLatches )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pLatch, * pFanin, * pFanout;
    int i, k, nTotal, nDigits;
    if ( nLatches < 1 )
        return;
    nTotal = nLatches * Abc_NtkPiNum(pNtk);
    nDigits = Abc_Base10Log( nTotal );
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        // remember current fanins of the PI
        Abc_NodeCollectFanouts( pObj, vNodes );
        // create the latches
        for ( pFanin = pObj, k = 0; k < nLatches; k++, pFanin = pLatch )
        {
            pLatch = Abc_NtkCreateLatch( pNtk );
            Abc_ObjAddFanin( pLatch, pFanin );
            Abc_LatchSetInitDc( pLatch );
            // create the name of the new latch
            Abc_ObjAssignName( pLatch, Abc_ObjNameDummy("LL", i*nLatches + k, nDigits), NULL );
        }
        // patch the PI fanouts
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pFanout, k )
            Abc_ObjPatchFanin( pFanout, pObj, pFanin );
    }
    Vec_PtrFree( vNodes );
    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
}